

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O3

void ON_SortUnsignedIntArray(sort_algorithm sort_algorithm,uint *a,size_t nel)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  uint *puVar14;
  uint *lostk [62];
  undefined8 auStack_3f8 [62];
  undefined8 auStack_208 [62];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (uint *)0x0) {
      uVar5 = nel >> 1;
      puVar4 = a + (nel - 1);
      uVar6 = nel - 1;
      do {
        if (uVar5 == 0) {
          uVar9 = *puVar4;
          *puVar4 = *a;
          uVar6 = uVar6 - 1;
          if (uVar6 == 0) {
            *a = uVar9;
            return;
          }
          puVar4 = puVar4 + -1;
          uVar5 = 0;
        }
        else {
          uVar9 = a[uVar5 - 1];
          uVar5 = uVar5 - 1;
        }
        puVar7 = a + uVar5;
        uVar13 = uVar5;
        while (uVar2 = uVar13 * 2, uVar2 < uVar6) {
          puVar10 = a + uVar2 + 1;
          uVar13 = uVar2 | 1;
          if (uVar13 < uVar6) {
            uVar11 = *puVar10;
            uVar1 = a[uVar2 + 2];
            uVar8 = uVar11;
            if (uVar11 < uVar1) {
              puVar10 = a + uVar2 + 2;
              uVar8 = uVar1;
            }
            uVar13 = uVar13 + (uVar11 < uVar1);
          }
          else {
            uVar8 = *puVar10;
          }
          if (uVar8 <= uVar9) break;
          *puVar7 = uVar8;
          puVar7 = puVar10;
        }
        *puVar7 = uVar9;
      } while( true );
    }
  }
  else if (1 < nel && a != (uint *)0x0) {
    uVar5 = 0;
    puVar4 = a + (nel - 1);
LAB_005b1639:
    while( true ) {
      iVar3 = (int)uVar5;
      uVar6 = ((long)puVar4 - (long)a >> 2) + 1;
      if (uVar6 < 9) break;
      puVar7 = (uint *)((long)a + (uVar6 & 0xfffffffffffffffe) * 2);
      uVar9 = *a;
      uVar11 = *puVar7;
      uVar8 = uVar9;
      if (uVar11 < uVar9) {
        *a = uVar11;
        *puVar7 = uVar9;
        uVar8 = *a;
        uVar11 = uVar9;
      }
      uVar9 = *puVar4;
      if (uVar9 < uVar8) {
        *a = uVar9;
        *puVar4 = uVar8;
        uVar11 = *puVar7;
        uVar9 = uVar8;
      }
      puVar10 = a;
      puVar12 = puVar4;
      if (uVar9 < uVar11) {
        *puVar7 = uVar9;
        *puVar4 = uVar11;
      }
LAB_005b1691:
      if (puVar10 < puVar7) {
        do {
          puVar10 = puVar10 + 1;
          if (puVar7 <= puVar10) break;
        } while (*puVar10 <= *puVar7);
      }
      if (puVar7 <= puVar10) {
        do {
          puVar10 = puVar10 + 1;
          if (puVar4 < puVar10) break;
        } while (*puVar10 <= *puVar7);
      }
      do {
        puVar14 = puVar12;
        puVar12 = puVar14 + -1;
        if (puVar12 <= puVar7) break;
      } while (*puVar7 < *puVar12);
      if (puVar10 <= puVar12) {
        uVar9 = *puVar10;
        *puVar10 = *puVar12;
        *puVar12 = uVar9;
        if (puVar12 == puVar7) {
          puVar7 = puVar10;
        }
        goto LAB_005b1691;
      }
      if (puVar7 < puVar14) {
        do {
          puVar14 = puVar12;
          if (puVar14 <= puVar7) break;
          puVar12 = puVar14 + -1;
        } while (*puVar14 == *puVar7);
      }
      if (puVar14 <= puVar7) {
        do {
          puVar14 = puVar14 + -1;
          if (puVar14 <= a) break;
        } while (*puVar14 == *puVar7);
      }
      if ((long)puVar14 - (long)a < (long)puVar4 - (long)puVar10) goto LAB_005b17c0;
      if (a < puVar14) {
        auStack_208[iVar3] = a;
        auStack_3f8[iVar3] = puVar14;
        uVar5 = (ulong)(iVar3 + 1);
      }
      iVar3 = (int)uVar5;
      a = puVar10;
      if (puVar4 <= puVar10) goto LAB_005b17e3;
    }
    if (a < puVar4) {
      do {
        puVar7 = a;
        if (a + 1 <= puVar4) {
          uVar9 = *a;
          puVar10 = a + 1;
          do {
            if (uVar9 < *puVar10) {
              puVar7 = puVar10;
              uVar9 = *puVar10;
            }
            puVar10 = puVar10 + 1;
          } while (puVar10 <= puVar4);
        }
        uVar9 = *puVar7;
        *puVar7 = *puVar4;
        *puVar4 = uVar9;
        puVar4 = puVar4 + -1;
      } while (a < puVar4);
    }
    goto LAB_005b17e3;
  }
  return;
LAB_005b17c0:
  if (puVar10 < puVar4) {
    auStack_208[iVar3] = puVar10;
    auStack_3f8[iVar3] = puVar4;
    uVar5 = (ulong)(iVar3 + 1);
  }
  iVar3 = (int)uVar5;
  puVar4 = puVar14;
  if (puVar14 <= a) {
LAB_005b17e3:
    if (iVar3 < 1) {
      return;
    }
    uVar5 = (ulong)(iVar3 - 1);
    a = (uint *)auStack_208[uVar5];
    puVar4 = (uint *)auStack_3f8[uVar5];
  }
  goto LAB_005b1639;
}

Assistant:

void ON_SortUnsignedIntArray(
        ON::sort_algorithm sort_algorithm,
        unsigned int* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_uint(a,nel);
  else
    ON_qsort_uint(a,nel);
}